

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_orderedCollection_asArray(sysbvm_context_t *context,sysbvm_tuple_t orderedCollection)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  
  if ((orderedCollection & 0xf) != 0 || orderedCollection == 0) {
    return 0;
  }
  sVar2 = *(sysbvm_tuple_t *)(orderedCollection + 0x18);
  if (sVar2 != 0) {
    uVar1 = *(ulong *)(orderedCollection + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      sVar2 = sysbvm_array_getFirstElements(context,sVar2,(long)uVar1 >> 4);
      return sVar2;
    }
    sVar2 = sysbvm_array_getFirstElements(context,sVar2,*(size_t *)(uVar1 + 0x10));
    return sVar2;
  }
  sVar2 = sysbvm_array_create(context,0);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedCollection_asArray(sysbvm_context_t *context, sysbvm_tuple_t orderedCollection)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection))
        return SYSBVM_NULL_TUPLE;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    if(!orderedCollectionObject->storage)
        return sysbvm_array_create(context, 0);

    return sysbvm_array_getFirstElements(context, orderedCollectionObject->storage, sysbvm_tuple_size_decode(orderedCollectionObject->size));
}